

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-ben.cpp
# Opt level: O1

void printName(PSNode *node,bool dot)

{
  PSNodeType type;
  raw_ostream *prVar1;
  char cVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  string nm;
  ostringstream ostr;
  code *local_218;
  undefined4 local_210;
  long local_208;
  undefined8 uStack_200;
  long local_1f8;
  undefined1 local_1f0;
  undefined8 local_1e8;
  undefined4 local_1e0;
  ostringstream *local_1d8;
  char *local_1d0;
  undefined8 local_1c8;
  char local_1c0;
  undefined7 uStack_1bf;
  long *local_1b0 [2];
  long local_1a0 [2];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  local_1c8 = 0;
  local_1c0 = '\0';
  type = *(PSNodeType *)(node + 0x90);
  pcVar3 = "unknown";
  if (type != UNKNOWN_MEM) {
    pcVar3 = (char *)0x0;
  }
  pcVar5 = "null";
  if (type != NULL_ADDR) {
    pcVar5 = pcVar3;
  }
  local_1d0 = &local_1c0;
  if (type - INVALIDATED < 0xfffffffe) {
    prVar1 = *(raw_ostream **)(node + 0x18);
    if (prVar1 == (raw_ostream *)0x0) {
      printPSNodeType(type);
      printf(" %p\n",node);
      goto LAB_0010d633;
    }
    std::__cxx11::ostringstream::ostringstream(local_190);
    local_210 = 0;
    local_1f0 = 0;
    local_1e8 = 0;
    local_1e0 = 1;
    local_208 = 0;
    uStack_200 = 0;
    local_1f8 = 0;
    local_218 = std::__throw_length_error;
    local_1d8 = local_190;
    if (prVar1[0x10] == (raw_ostream)0x0) {
      pcVar3 = (char *)llvm::Value::getName();
      llvm::raw_ostream::operator<<((raw_ostream *)&local_218,pcVar3);
    }
    else {
      llvm::Value::print(prVar1,SUB81(&local_218,0));
    }
    if (local_1f8 != local_208) {
      llvm::raw_ostream::flush_nonempty();
    }
    std::__cxx11::stringbuf::str();
    llvm::raw_os_ostream::~raw_os_ostream((raw_os_ostream *)&local_218);
    std::__cxx11::ostringstream::~ostringstream(local_190);
    std::ios_base::~ios_base(local_120);
    std::__cxx11::string::operator=((string *)&local_1d0,(string *)local_1b0);
    pcVar5 = local_1d0;
    if (local_1b0[0] != local_1a0) {
      operator_delete(local_1b0[0],local_1a0[0] + 1);
      pcVar5 = local_1d0;
    }
  }
  cVar2 = *pcVar5;
  if (cVar2 != '\0') {
    lVar4 = 1;
    do {
      if (lVar4 == 0x47) {
        printf(" ...");
        break;
      }
      if (cVar2 == '\"') {
        putchar(0x5c);
      }
      putchar((int)pcVar5[lVar4 + -1]);
      cVar2 = pcVar5[lVar4];
      lVar4 = lVar4 + 1;
    } while (cVar2 != '\0');
  }
LAB_0010d633:
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
  }
  return;
}

Assistant:

static void printName(PSNode *node, bool dot) {
    std::string nm;
    const char *name = nullptr;
    if (node->isNull()) {
        name = "null";
    } else if (node->isUnknownMemory()) {
        name = "unknown";
    }

    if (!name) {
        if (!node->getUserData<llvm::Value>()) {
            printPSNodeType(node->getType());
            if (dot)
                printf(" %p\\n", node);
            else
                printf(" %p\n", node);

            return;
        }

        nm = getInstName(node->getUserData<llvm::Value>());
        name = nm.c_str();
    }

    // escape the " character
    for (int i = 0; name[i] != '\0'; ++i) {
        // crop long names
        if (i >= 70) {
            printf(" ...");
            break;
        }

        if (name[i] == '"')
            putchar('\\');

        putchar(name[i]);
    }
}